

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

node_pred * recall_tree_ns::find_or_create(recall_tree *b,uint32_t cn,example *ec)

{
  node *pnVar1;
  node_pred *pnVar2;
  node_pred newls;
  node_pred local_30;
  
  pnVar2 = find(b,cn,ec);
  pnVar1 = (b->nodes)._begin;
  if (pnVar2 == pnVar1[cn].preds._end) {
    local_30.label = (uint32_t)(ec->l).simple.label;
    local_30.label_count = 0.0;
    v_array<recall_tree_ns::node_pred>::push_back(&pnVar1[cn].preds,&local_30);
    pnVar2 = (b->nodes)._begin[cn].preds._end + -1;
  }
  return pnVar2;
}

Assistant:

node_pred* find_or_create(recall_tree& b, uint32_t cn, example& ec)
{
  node_pred* ls = find(b, cn, ec);

  if (ls == b.nodes[cn].preds.end())
  {
    node_pred newls(ec.l.multi.label);
    b.nodes[cn].preds.push_back(newls);
    ls = b.nodes[cn].preds.end() - 1;
  }

  return ls;
}